

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O3

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_init::test_method
          (chainstatemanager_snapshot_init *this)

{
  lazy_ostream *assertion_descr;
  long lVar1;
  uint256 *puVar2;
  _Head_base<0UL,_Chainstate_*,_false> _Var3;
  uchar *puVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  element_type *peVar13;
  char cVar14;
  bool bVar15;
  byte bVar16;
  int iVar17;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar18;
  Chainstate *pCVar19;
  Chainstate *pCVar20;
  ChainstateManager *pCVar21;
  unit_test_log_t *puVar22;
  element_type *peVar23;
  RecursiveMutex *pmutexIn;
  char *pcVar24;
  iterator pvVar25;
  iterator in_R9;
  iterator pvVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar29;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined4 local_364;
  __pthread_internal_list local_360;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  assertion_result local_230;
  undefined1 local_218 [8];
  begin local_210;
  undefined8 local_1f8;
  undefined1 local_1f0 [16];
  char *local_1e0;
  undefined1 *local_1d8;
  lazy_ostream *local_1d0;
  undefined1 local_1c8 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  shared_count sStack_178;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  uchar uStack_169;
  BlockValidationState unused_state;
  DisconnectedBlockTransactions unused_pool;
  uint256 snapshot_tip_hash;
  path local_88;
  path snapshot_chainstate_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar24 = "m_node.chainman";
  puVar18 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (&(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
                        super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                       ,0x22e,"test_method","m_node.chainman");
  pCVar21 = (puVar18->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar19 = ChainstateManager::ActiveChainstate(pCVar21);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)&unused_pool);
  ::node::FindSnapshotChainstateDir
            ((optional<fs::path> *)&unused_pool,&(pCVar21->m_options).datadir);
  std::filesystem::__cxx11::path::path(&snapshot_chainstate_dir.super_path,(path *)&unused_pool);
  if ((char)unused_pool.iters_by_txid._M_h.
            super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            .
            super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
            .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0 == '\x01') {
    unused_pool.iters_by_txid._M_h.
    super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    .
    super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
    .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0._0_1_ = '\0';
    std::filesystem::__cxx11::path::~path((path *)&unused_pool);
  }
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x234;
  file.m_begin = (iterator)&local_240;
  msg.m_end = in_R9;
  msg.m_begin = pcVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_250,msg);
  _cVar29 = 0x76555c;
  cVar14 = std::filesystem::status((path *)&snapshot_chainstate_dir);
  unused_state.super_ValidationState<BlockValidationResult>.m_mode._0_1_ =
       cVar14 != -1 && cVar14 != '\0';
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)(local_1f0 + 8);
  local_1f0._8_8_ = "fs::exists(snapshot_chainstate_dir)";
  local_1e0 = "";
  unused_pool.m_max_mem_usage._0_1_ = 0;
  unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_01389048;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_258 = "";
  pvVar25 = (iterator)0x1;
  pvVar26 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&unused_state,(lazy_ostream *)&unused_pool,1,0,WARN,_cVar29,
             (size_t)&local_260,0x234);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
              _M_string_length);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x235;
  file_00.m_begin = (iterator)&local_270;
  msg_00.m_end = pvVar26;
  msg_00.m_begin = pvVar25;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_280,
             msg_00);
  local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
  local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
  local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  ArgsManager::GetDataDir((path *)&local_88,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x13,"chainstate_snapshot");
  std::filesystem::__cxx11::path::path((path *)&unused_pool,&local_88);
  iVar17 = std::filesystem::__cxx11::path::compare((path *)&snapshot_chainstate_dir);
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0] = iVar17 == 0;
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  criticalblock1.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
  criticalblock1.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&criticalblock2;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._1_8_ <<
                8);
  unused_state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01389518;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1d0 = (lazy_ostream *)&local_230;
  local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
  local_1f0._8_8_ = &PTR__lazy_ostream_01389518;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  pvVar25 = (iterator)0x1;
  pvVar26 = (iterator)0x2;
  local_230._0_8_ = (element_type *)&unused_pool;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)&snapshot_chainstate_dir;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&snapshot_tip_hash,(lazy_ostream *)&local_210,1,2,REQUIRE,0xf557e4,
             (size_t)&criticalblock1,0x235,(assertion_result *)&unused_state,
             "gArgs.GetDataDirNet() / \"chainstate_snapshot\"",local_1f0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::filesystem::__cxx11::path::~path((path *)&unused_pool);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x237;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar26;
  msg_01.m_begin = pvVar25;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  _cVar29 = 0x765812;
  bVar15 = ChainstateManager::IsSnapshotActive(pCVar21);
  unused_state.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar15;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  local_1f0._8_8_ = "chainman.IsSnapshotActive()";
  local_1e0 = "";
  unused_pool.m_max_mem_usage._0_1_ = 0;
  unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_01389048;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)(local_1f0 + 8);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a8 = "";
  pvVar25 = (iterator)0x1;
  pvVar26 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&unused_state,(lazy_ostream *)&unused_pool,1,0,WARN,_cVar29,
             (size_t)&local_2b0,0x237);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
              _M_string_length);
  unused_pool.cachedInnerUsage = (uint64_t)&cs_main;
  unused_pool.m_max_mem_usage._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&unused_pool);
  pCVar20 = ChainstateManager::ActiveChainstate(pCVar21);
  puVar2 = (pCVar20->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar2 != (uint256 *)0x0) {
    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ =
         *(undefined1 (*) [16])((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&unused_pool);
    ChainstateManager::GetAll(&all_chainstates,pCVar21);
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x23c;
    file_02.m_begin = (iterator)&local_2d8;
    msg_02.m_end = pvVar26;
    msg_02.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e8,
               msg_02);
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01388f08;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = (lazy_ostream *)0xf4aea1;
    local_1c8._0_8_ =
         (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
    local_230._0_8_ = &criticalblock49;
    criticalblock49.super_unique_lock._M_device =
         (mutex_type *)CONCAT44(criticalblock49.super_unique_lock._M_device._4_4_,2);
    local_210.m_file_name.m_end = (iterator)0x0;
    local_210.m_line_num = 0;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e215e9;
    criticalblock1.super_unique_lock._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
         + 0x7b;
    unused_pool.m_max_mem_usage._0_1_ = 0;
    unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_01388f48;
    unused_pool.queuedTx.
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)boost::unit_test::lazy_ostream::inst;
    unused_pool.queuedTx.
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&criticalblock2;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)(unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._1_8_
                  << 8);
    unused_state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013890c8;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (size_type)&local_230;
    criticalblock2.super_unique_lock._M_device = (mutex_type *)local_1c8;
    local_210.m_file_name.m_begin._0_1_ =
         (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x10;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_210,(lazy_ostream *)(local_1f0 + 8),1,2,REQUIRE,0xf5583e,
               (size_t)&criticalblock1,0x23c,&unused_pool,"2",(assertion_result *)&unused_state);
    boost::detail::shared_count::~shared_count((shared_count *)&local_210.m_line_num);
    DisconnectedBlockTransactions::DisconnectedBlockTransactions(&unused_pool,20000000);
    unused_state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    unused_state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
    ;
    unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity =
         unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
         _M_allocated_capacity & 0xffffffffffffff00;
    unused_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2
    ;
    unused_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
    [0] = '\0';
    criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock1.super_unique_lock._8_8_ =
         criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
    pmutexIn = &pCVar19->m_mempool->cs;
    if (pCVar19->m_mempool == (CTxMemPool *)0x0) {
      pmutexIn = (RecursiveMutex *)0x0;
    }
    pvVar25 = (iterator)0x246;
    pvVar26 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock2,pmutexIn,"bg_chainstate.MempoolMutex()",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x246,false);
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x247;
    file_03.m_begin = (iterator)&local_2f8;
    msg_03.m_end = pvVar26;
    msg_03.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_308,
               msg_03);
    _cVar29 = 0x765b71;
    bVar15 = Chainstate::DisconnectTip(pCVar19,&unused_state,&unused_pool);
    local_210.m_file_name.m_begin = (iterator)CONCAT71(local_210.m_file_name.m_begin._1_7_,bVar15);
    local_210.m_file_name.m_end = (iterator)0x0;
    local_210.m_line_num = 0;
    local_230._0_8_ = "bg_chainstate.DisconnectTip(unused_state, &unused_pool)";
    local_230.m_message.px = (element_type *)0xf558a9;
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01389048;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = (lazy_ostream *)&local_230;
    local_318 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_310 = "";
    pvVar25 = (iterator)0x1;
    pvVar26 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_210,(lazy_ostream *)(local_1f0 + 8),1,0,WARN,_cVar29,
               (size_t)&local_318,0x247);
    boost::detail::shared_count::~shared_count((shared_count *)&local_210.m_line_num);
    DisconnectedBlockTransactions::clear(&unused_pool);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x24a;
    file_04.m_begin = (iterator)&local_328;
    msg_04.m_end = pvVar26;
    msg_04.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_338,
               msg_04);
    criticalblock1.super_unique_lock._8_8_ =
         criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
    local_1f0._0_4_ =
         (int)((ulong)((long)(pCVar19->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar19->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_1c8._0_8_ = local_1f0;
    criticalblock49.super_unique_lock._M_device = (mutex_type *)local_218;
    criticalblock2.super_unique_lock._M_device =
         (mutex_type *)
         CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,local_1f0._0_4_ == 0x6d);
    local_218._0_4_ = 0x6d;
    criticalblock2.super_unique_lock._8_8_ = (element_type *)0x0;
    sStack_178.pi_ = (sp_counted_base *)0x0;
    local_230._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_230.m_message.px = (element_type *)0xf54b3e;
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_013890c8;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
    local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013890c8;
    local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_1f8 = &criticalblock49;
    pvVar25 = (iterator)0x1;
    pvVar26 = (iterator)0x2;
    local_1d0 = (lazy_ostream *)local_1c8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
               0xf558aa,(size_t)&local_230,0x24a,(lazy_ostream *)(local_1f0 + 8),"109",&local_210);
    boost::detail::shared_count::~shared_count(&sStack_178);
    pCVar21 = SnapshotTestSetup::SimulateNodeRestart(&this->super_SnapshotTestSetup);
    local_210.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_210.m_line_num = 0x251;
    local_210.m_file_name.m_end = "";
    puVar22 = boost::unit_test::unit_test_log_t::operator<<
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210);
    boost::unit_test::unit_test_log_t::operator()
              ((unit_test_log_t *)&criticalblock1,(log_level)puVar22);
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01389ed0;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = (lazy_ostream *)0xf558cd;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&criticalblock1,(lazy_ostream *)(local_1f0 + 8));
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&criticalblock1);
    ChainTestingSetup::LoadVerifyActivateChainstate((ChainTestingSetup *)this);
    criticalblock49.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock49.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock49.super_unique_lock);
    local_348 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_340 = "";
    local_360.__next = (__pthread_internal_list *)&boost::unit_test::basic_cstring<char_const>::null
    ;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x258;
    file_05.m_begin = (iterator)&local_348;
    msg_05.m_end = pvVar26;
    msg_05.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
               (size_t)&local_360.__next,msg_05);
    criticalblock1.super_unique_lock._8_8_ =
         criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
    ChainstateManager::GetAll
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_230,pCVar21);
    local_360.__prev =
         (__pthread_internal_list *)((long)local_230.m_message.px - local_230._0_8_ >> 3);
    local_1f0._0_8_ = &local_360;
    local_218 = (undefined1  [8])&local_364;
    local_364 = 2;
    criticalblock2.super_unique_lock._M_device =
         (mutex_type *)
         CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,
                  (long)local_230.m_message.px - local_230._0_8_ == 0x10);
    criticalblock2.super_unique_lock._8_8_ = (element_type *)0x0;
    sStack_178.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_1c8._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
         + 0x7b;
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01388f48;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = (lazy_ostream *)local_1f0;
    local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
    local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013890c8;
    local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_1f8 = local_218;
    pvVar25 = (iterator)0x1;
    pvVar26 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
               0xf558fb,(size_t)local_1c8,600,(lazy_ostream *)(local_1f0 + 8),"2",&local_210);
    boost::detail::shared_count::~shared_count(&sStack_178);
    if ((element_type *)local_230._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_230._0_8_,(long)local_230.m_message.pn.pi_ - local_230._0_8_);
    }
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x259;
    file_06.m_begin = (iterator)&local_378;
    msg_06.m_end = pvVar26;
    msg_06.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_388,
               msg_06);
    _cVar29 = 0x766054;
    bVar15 = ChainstateManager::IsSnapshotActive(pCVar21);
    local_210.m_file_name.m_end = (iterator)0x0;
    local_210.m_line_num = 0;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)0xf55b7a;
    criticalblock1.super_unique_lock._8_8_ = (long)"!chainman_restarted.IsSnapshotActive()" + 0x26;
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01389048;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_390 = "";
    pvVar25 = (iterator)0x1;
    pvVar26 = (iterator)0x0;
    local_1d0 = (lazy_ostream *)&criticalblock1;
    local_210.m_file_name.m_begin._0_1_ = bVar15;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_210,(lazy_ostream *)(local_1f0 + 8),1,0,WARN,_cVar29,
               (size_t)&local_398,0x259);
    boost::detail::shared_count::~shared_count((shared_count *)&local_210.m_line_num);
    local_3a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3a0 = "";
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar29 = 0x766122;
    file_07.m_end = (iterator)0x25a;
    file_07.m_begin = (iterator)&local_3a8;
    msg_07.m_end = pvVar26;
    msg_07.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3b8,
               msg_07);
    bVar16 = 1;
    if (((pCVar21->m_snapshot_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
       (_Var3._M_head_impl =
             (pCVar21->m_ibd_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
       _Var3._M_head_impl != (Chainstate *)0x0)) {
      bVar16 = (_Var3._M_head_impl)->m_disabled ^ 1;
    }
    local_210.m_file_name.m_begin = (iterator)CONCAT71(local_210.m_file_name.m_begin._1_7_,bVar16);
    local_210.m_file_name.m_end = (iterator)0x0;
    local_210.m_line_num = 0;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e2eab4;
    criticalblock1.super_unique_lock._8_8_ =
         (long)"!chainman_restarted.IsSnapshotValidated()" + 0x29;
    assertion_descr = (lazy_ostream *)(local_1f0 + 8);
    local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
    local_1f0._8_8_ = &PTR__lazy_ostream_01389048;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3c0 = "";
    pvVar25 = (iterator)0x1;
    pvVar26 = (iterator)0x0;
    local_1d0 = (lazy_ostream *)&criticalblock1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_210,assertion_descr,1,0,WARN,_cVar29,(size_t)&local_3c8,
               0x25a);
    boost::detail::shared_count::~shared_count((shared_count *)&local_210.m_line_num);
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x25c;
    file_08.m_begin = (iterator)&local_3d8;
    msg_08.m_end = pvVar26;
    msg_08.m_begin = pvVar25;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3e8,
               msg_08);
    criticalblock1.super_unique_lock._8_8_ =
         criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
    criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
    pCVar19 = ChainstateManager::ActiveChainstate(pCVar21);
    puVar2 = (pCVar19->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar2 != (uint256 *)0x0) {
      criticalblock2.super_unique_lock._M_device =
           *(mutex_type **)(puVar2->super_base_blob<256U>).m_data._M_elems;
      puVar4 = (puVar2->super_base_blob<256U>).m_data._M_elems + 8;
      uVar5 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x10];
      uVar6 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x11];
      uVar7 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x12];
      uVar8 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x13];
      uVar9 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x14];
      uVar10 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x15];
      uVar11 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x16];
      uVar12 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x17];
      uStack_170 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x18];
      uStack_16f = (puVar2->super_base_blob<256U>).m_data._M_elems[0x19];
      uStack_16e = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1a];
      uStack_16d = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1b];
      uStack_16c = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1c];
      uStack_16b = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1d];
      uStack_16a = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1e];
      uStack_169 = (puVar2->super_base_blob<256U>).m_data._M_elems[0x1f];
      sStack_178.pi_._0_1_ = uVar5;
      sStack_178.pi_._1_1_ = uVar6;
      sStack_178.pi_._2_1_ = uVar7;
      sStack_178.pi_._3_1_ = uVar8;
      sStack_178.pi_._4_1_ = uVar9;
      sStack_178.pi_._5_1_ = uVar10;
      sStack_178.pi_._6_1_ = uVar11;
      sStack_178.pi_._7_1_ = uVar12;
      criticalblock2.super_unique_lock._M_owns = (bool)puVar4[0];
      criticalblock2.super_unique_lock._9_1_ = puVar4[1];
      criticalblock2.super_unique_lock._10_1_ = puVar4[2];
      criticalblock2.super_unique_lock._11_1_ = puVar4[3];
      criticalblock2.super_unique_lock._12_1_ = puVar4[4];
      criticalblock2.super_unique_lock._13_1_ = puVar4[5];
      criticalblock2.super_unique_lock._14_1_ = puVar4[6];
      criticalblock2.super_unique_lock._15_1_ = puVar4[7];
      auVar28[0] = -(uVar5 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar28[1] = -(uVar6 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar28[2] = -(uVar7 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar28[3] = -(uVar8 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar28[4] = -(uVar9 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar28[5] = -(uVar10 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar28[6] = -(uVar11 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar28[7] = -(uVar12 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar28[8] = -(uStack_170 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar28[9] = -(uStack_16f == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar28[10] = -(uStack_16e == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar28[0xb] = -(uStack_16d == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar28[0xc] = -(uStack_16c == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar28[0xd] = -(uStack_16b == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar28[0xe] = -(uStack_16a == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar28[0xf] = -(uStack_169 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar27[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar27[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar27[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar27[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar27[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar27[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar27[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar27[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar27[8] = -(*puVar4 == snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar27[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar27[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar27[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar27[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar27[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar27[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar27[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar27 = auVar27 & auVar28;
      local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff);
      local_230.m_message.px = (element_type *)0x0;
      local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1c8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_1c8._8_8_ =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
           + 0x7b;
      local_1f0._0_8_ = &criticalblock2;
      local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
      local_1f0._8_8_ = &PTR__lazy_ostream_01389a00;
      local_1d8 = boost::unit_test::lazy_ostream::inst;
      local_1d0 = (lazy_ostream *)local_1f0;
      local_218 = (undefined1  [8])&snapshot_tip_hash;
      local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
      local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389a00;
      local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_1f8 = local_218;
      pvVar25 = (iterator)0x1;
      pvVar26 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_230,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,0xf55948,(size_t)local_1c8,
                 0x25c,assertion_descr,"snapshot_tip_hash",&local_210);
      boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
      local_3f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_3f0 = "";
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0x25d;
      file_09.m_begin = (iterator)&local_3f8;
      msg_09.m_end = pvVar26;
      msg_09.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_408,
                 msg_09);
      criticalblock1.super_unique_lock._8_8_ =
           criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
      pCVar19 = ChainstateManager::ActiveChainstate(pCVar21);
      iVar17 = (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pCVar19->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
      local_360.__prev._0_4_ = 0xd2;
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,iVar17 == 0xd2);
      criticalblock2.super_unique_lock._8_8_ = (element_type *)0x0;
      sStack_178.pi_ = (sp_counted_base *)0x0;
      local_230._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_230.m_message.px = (element_type *)0xf54b3e;
      local_1c8._0_8_ = local_218;
      local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
      local_1f0._8_8_ = &PTR__lazy_ostream_013890c8;
      local_1d8 = boost::unit_test::lazy_ostream::inst;
      local_1f0._0_8_ = &local_360;
      local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
      local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013890c8;
      local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_1f8 = local_1f0;
      pvVar25 = (iterator)0x1;
      pvVar26 = (iterator)0x2;
      local_1d0 = (lazy_ostream *)local_1c8;
      local_218._0_4_ = iVar17;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
                 0xf55989,(size_t)&local_230,0x25d,assertion_descr,"210",&local_210);
      boost::detail::shared_count::~shared_count(&sStack_178);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
      local_210.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_210.m_line_num = 0x261;
      local_210.m_file_name.m_end = "";
      puVar22 = boost::unit_test::unit_test_log_t::operator<<
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210);
      boost::unit_test::unit_test_log_t::operator()
                ((unit_test_log_t *)&criticalblock1,(log_level)puVar22);
      local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
      local_1f0._8_8_ = &PTR__lazy_ostream_0138c700;
      local_1d8 = boost::unit_test::lazy_ostream::inst;
      local_1d0 = (lazy_ostream *)0xf559af;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&criticalblock1,(lazy_ostream *)(local_1f0 + 8));
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&criticalblock1);
      TestChain100Setup::mineBlocks((TestChain100Setup *)this,10);
      criticalblock49.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock49.super_unique_lock._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock49.super_unique_lock);
      local_418 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_410 = "";
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      local_420 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x265;
      file_10.m_begin = (iterator)&local_418;
      msg_10.m_end = pvVar26;
      msg_10.m_begin = pvVar25;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
                 msg_10);
      criticalblock1.super_unique_lock._8_8_ =
           criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
      pCVar19 = ChainstateManager::ActiveChainstate(pCVar21);
      local_218._0_4_ =
           (int)((ulong)((long)(pCVar19->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar19->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
      local_360.__prev = (__pthread_internal_list *)CONCAT44(local_360.__prev._4_4_,0xdc);
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,local_218._0_4_ == 0xdc);
      criticalblock2.super_unique_lock._8_8_ = (element_type *)0x0;
      sStack_178.pi_ = (sp_counted_base *)0x0;
      local_230._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_230.m_message.px = (element_type *)0xf54b3e;
      local_1c8._0_8_ = local_218;
      local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
      local_1f0._8_8_ = &PTR__lazy_ostream_013890c8;
      local_1d8 = boost::unit_test::lazy_ostream::inst;
      local_1f0._0_8_ = &local_360;
      local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
      local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013890c8;
      local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_1f8 = local_1f0;
      pvVar25 = (iterator)0x1;
      pvVar26 = (iterator)0x2;
      local_1d0 = (lazy_ostream *)local_1c8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
                 0xf55989,(size_t)&local_230,0x265,local_1f0 + 8,"220",&local_210);
      boost::detail::shared_count::~shared_count(&sStack_178);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_230,pCVar21);
      peVar13 = local_230.m_message.px;
      if ((element_type *)local_230._0_8_ != local_230.m_message.px) {
        peVar23 = (element_type *)local_230._0_8_;
        do {
          pCVar19 = (Chainstate *)
                    (peVar23->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream;
          pCVar20 = ChainstateManager::ActiveChainstate(pCVar21);
          if (pCVar19 != pCVar20) {
            local_438 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
            ;
            local_430 = "";
            local_448 = &boost::unit_test::basic_cstring<char_const>::null;
            local_440 = &boost::unit_test::basic_cstring<char_const>::null;
            file_11.m_end = (iterator)0x26b;
            file_11.m_begin = (iterator)&local_438;
            msg_11.m_end = pvVar26;
            msg_11.m_begin = pvVar25;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                       (size_t)&local_448,msg_11);
            criticalblock1.super_unique_lock._8_8_ =
                 criticalblock1.super_unique_lock._8_8_ & 0xffffffffffffff00;
            criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
            iVar17 = (int)((ulong)((long)(pCVar19->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar19->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
            local_360.__prev = (__pthread_internal_list *)CONCAT44(local_360.__prev._4_4_,iVar17);
            local_364 = 0x6d;
            criticalblock2.super_unique_lock._M_device =
                 (mutex_type *)
                 CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,iVar17 == 0x6d);
            criticalblock2.super_unique_lock._8_8_ = (element_type *)0x0;
            sStack_178.pi_ = (sp_counted_base *)0x0;
            local_1c8._0_8_ =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
            ;
            local_1c8._8_8_ =
                 (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                 + 0x7b;
            local_1f0._0_8_ = &local_360;
            local_1e0 = (char *)((ulong)local_1e0 & 0xffffffffffffff00);
            local_1f0._8_8_ = &PTR__lazy_ostream_013890c8;
            local_1d8 = boost::unit_test::lazy_ostream::inst;
            local_1d0 = (lazy_ostream *)local_1f0;
            local_218 = (undefined1  [8])&local_364;
            local_210.m_file_name.m_end = (iterator)(local_210._9_8_ << 8);
            local_210.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013890c8;
            local_210.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
            local_1f8 = local_218;
            pvVar25 = (iterator)0x1;
            pvVar26 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,
                       REQUIRE,0xf559f7,(size_t)local_1c8,0x26b,local_1f0 + 8,"109",&local_210);
            boost::detail::shared_count::~shared_count(&sStack_178);
          }
          peVar23 = (element_type *)
                    &(peVar23->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x8;
        } while (peVar23 != peVar13);
      }
      if ((element_type *)local_230._0_8_ != (element_type *)0x0) {
        operator_delete((void *)local_230._0_8_,(long)local_230.m_message.pn.pi_ - local_230._0_8_);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unused_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
             _M_p !=
          &unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
        operator_delete(unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        CONCAT71(unused_state.super_ValidationState<BlockValidationResult>.
                                 m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 unused_state.super_ValidationState<BlockValidationResult>.
                                 m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
             _M_p !=
          &unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
        operator_delete(unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        field_2._M_allocated_capacity + 1);
      }
      DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&unused_pool);
      if (all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(all_chainstates.
                        super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)all_chainstates.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)all_chainstates.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::filesystem::__cxx11::path::~path(&snapshot_chainstate_dir.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_init, SnapshotTestSetup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& bg_chainstate = chainman.ActiveChainstate();

    this->SetupSnapshot();

    fs::path snapshot_chainstate_dir = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));
    BOOST_CHECK_EQUAL(snapshot_chainstate_dir, gArgs.GetDataDirNet() / "chainstate_snapshot");

    BOOST_CHECK(chainman.IsSnapshotActive());
    const uint256 snapshot_tip_hash = WITH_LOCK(chainman.GetMutex(),
        return chainman.ActiveTip()->GetBlockHash());

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 2);

    // "Rewind" the background chainstate so that its tip is not at the
    // base block of the snapshot - this is so after simulating a node restart,
    // it will initialize instead of attempting to complete validation.
    //
    // Note that this is not a realistic use of DisconnectTip().
    DisconnectedBlockTransactions unused_pool{MAX_DISCONNECTED_TX_POOL_BYTES};
    BlockValidationState unused_state;
    {
        LOCK2(::cs_main, bg_chainstate.MempoolMutex());
        BOOST_CHECK(bg_chainstate.DisconnectTip(unused_state, &unused_pool));
        unused_pool.clear();  // to avoid queuedTx assertion errors on teardown
    }
    BOOST_CHECK_EQUAL(bg_chainstate.m_chain.Height(), 109);

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully cleans up the background-validation
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates.
    this->LoadVerifyActivateChainstate();

    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 2);
        BOOST_CHECK(chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());

        BOOST_CHECK_EQUAL(chainman_restarted.ActiveTip()->GetBlockHash(), snapshot_tip_hash);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the initialized snapshot chainstate");
    mineBlocks(10);
    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);

        // Background chainstate should be unaware of new blocks on the snapshot
        // chainstate.
        for (Chainstate* cs : chainman_restarted.GetAll()) {
            if (cs != &chainman_restarted.ActiveChainstate()) {
                BOOST_CHECK_EQUAL(cs->m_chain.Height(), 109);
            }
        }
    }
}